

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preset.cpp
# Opt level: O2

SFPreset * __thiscall sf2cute::SFPreset::operator=(SFPreset *this,SFPreset *origin)

{
  vector<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>_>_>
  *this_00;
  SFPresetZone *pSVar1;
  pointer puVar2;
  uint16_t uVar3;
  uint32_t uVar4;
  unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_> uVar5;
  __uniq_ptr_data<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>,_true,_true>
  in_RAX;
  pointer *__ptr;
  pointer puVar6;
  _Head_base<0UL,_sf2cute::SFPresetZone_*,_false> local_38;
  
  pSVar1 = (this->global_zone_)._M_t.
           super___uniq_ptr_impl<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>
           ._M_t.
           super__Tuple_impl<0UL,_sf2cute::SFPresetZone_*,_std::default_delete<sf2cute::SFPresetZone>_>
           .super__Head_base<0UL,_sf2cute::SFPresetZone_*,_false>._M_head_impl;
  (this->global_zone_)._M_t.
  super___uniq_ptr_impl<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>._M_t.
  super__Tuple_impl<0UL,_sf2cute::SFPresetZone_*,_std::default_delete<sf2cute::SFPresetZone>_>.
  super__Head_base<0UL,_sf2cute::SFPresetZone_*,_false>._M_head_impl = (SFPresetZone *)0x0;
  local_38._M_head_impl =
       (SFPresetZone *)
       in_RAX.
       super___uniq_ptr_impl<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>.
       _M_t.
       super__Tuple_impl<0UL,_sf2cute::SFPresetZone_*,_std::default_delete<sf2cute::SFPresetZone>_>.
       super__Head_base<0UL,_sf2cute::SFPresetZone_*,_false>._M_head_impl;
  if (pSVar1 != (SFPresetZone *)0x0) {
    (**(code **)((long)(pSVar1->super_SFZone)._vptr_SFZone + 8))();
  }
  if ((origin->global_zone_)._M_t.
      super___uniq_ptr_impl<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>._M_t
      .super__Tuple_impl<0UL,_sf2cute::SFPresetZone_*,_std::default_delete<sf2cute::SFPresetZone>_>.
      super__Head_base<0UL,_sf2cute::SFPresetZone_*,_false>._M_head_impl != (SFPresetZone *)0x0) {
    std::make_unique<sf2cute::SFPresetZone,sf2cute::SFPresetZone&>
              ((SFPresetZone *)&stack0xffffffffffffffc8);
    uVar5._M_t.
    super___uniq_ptr_impl<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>._M_t.
    super__Tuple_impl<0UL,_sf2cute::SFPresetZone_*,_std::default_delete<sf2cute::SFPresetZone>_>.
    super__Head_base<0UL,_sf2cute::SFPresetZone_*,_false>._M_head_impl =
         (__uniq_ptr_data<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>,_true,_true>
          )(__uniq_ptr_data<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>,_true,_true>
            )local_38._M_head_impl;
    local_38._M_head_impl = (SFPresetZone *)0x0;
    pSVar1 = (this->global_zone_)._M_t.
             super___uniq_ptr_impl<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>
             ._M_t.
             super__Tuple_impl<0UL,_sf2cute::SFPresetZone_*,_std::default_delete<sf2cute::SFPresetZone>_>
             .super__Head_base<0UL,_sf2cute::SFPresetZone_*,_false>._M_head_impl;
    (this->global_zone_)._M_t.
    super___uniq_ptr_impl<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>._M_t.
    super__Tuple_impl<0UL,_sf2cute::SFPresetZone_*,_std::default_delete<sf2cute::SFPresetZone>_>.
    super__Head_base<0UL,_sf2cute::SFPresetZone_*,_false>._M_head_impl =
         (SFPresetZone *)
         uVar5._M_t.
         super___uniq_ptr_impl<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>.
         _M_t.
         super__Tuple_impl<0UL,_sf2cute::SFPresetZone_*,_std::default_delete<sf2cute::SFPresetZone>_>
         .super__Head_base<0UL,_sf2cute::SFPresetZone_*,_false>._M_head_impl;
    if (pSVar1 != (SFPresetZone *)0x0) {
      (**(code **)((long)(pSVar1->super_SFZone)._vptr_SFZone + 8))();
      if (local_38._M_head_impl != (SFPresetZone *)0x0) {
        (**(code **)(*(long *)local_38._M_head_impl + 8))();
      }
    }
  }
  this_00 = &this->zones_;
  std::
  vector<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>_>_>
  ::clear(this_00);
  std::
  vector<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>_>_>
  ::reserve(this_00,(long)(origin->zones_).
                          super__Vector_base<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(origin->zones_).
                          super__Vector_base<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3);
  puVar2 = (origin->zones_).
           super__Vector_base<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar6 = (origin->zones_).
                super__Vector_base<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar6 != puVar2; puVar6 = puVar6 + 1) {
    std::make_unique<sf2cute::SFPresetZone,sf2cute::SFPresetZone&>
              ((SFPresetZone *)&stack0xffffffffffffffc8);
    std::
    vector<std::unique_ptr<sf2cute::SFPresetZone,std::default_delete<sf2cute::SFPresetZone>>,std::allocator<std::unique_ptr<sf2cute::SFPresetZone,std::default_delete<sf2cute::SFPresetZone>>>>
    ::
    emplace_back<std::unique_ptr<sf2cute::SFPresetZone,std::default_delete<sf2cute::SFPresetZone>>>
              ((vector<std::unique_ptr<sf2cute::SFPresetZone,std::default_delete<sf2cute::SFPresetZone>>,std::allocator<std::unique_ptr<sf2cute::SFPresetZone,std::default_delete<sf2cute::SFPresetZone>>>>
                *)this_00,
               (unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_> *)
               &stack0xffffffffffffffc8);
    if (local_38._M_head_impl != (SFPresetZone *)0x0) {
      (**(code **)(*(long *)local_38._M_head_impl + 8))();
    }
  }
  std::__cxx11::string::_M_assign((string *)this);
  uVar3 = origin->bank_;
  this->preset_number_ = origin->preset_number_;
  this->bank_ = uVar3;
  uVar4 = origin->genre_;
  this->library_ = origin->library_;
  this->genre_ = uVar4;
  this->morphology_ = origin->morphology_;
  this->parent_file_ = (SoundFont *)0x0;
  SetBackwardReferences(this);
  return this;
}

Assistant:

SFPreset & SFPreset::operator=(const SFPreset & origin) {
  // Copy global zone.
  global_zone_ = nullptr;
  if (origin.has_global_zone()) {
    global_zone_ = std::make_unique<SFPresetZone>(origin.global_zone());
  }

  // Copy preset zones.
  zones_.clear();
  zones_.reserve(origin.zones().size());
  for (const auto & zone : origin.zones()) {
    zones_.push_back(std::make_unique<SFPresetZone>(*zone));
  }

  // Copy other fields.
  name_ = origin.name_;
  preset_number_ = origin.preset_number_;
  bank_ = origin.bank_;
  library_ = origin.library_;
  genre_ = origin.genre_;
  morphology_ = origin.morphology_;
  parent_file_ = nullptr;

  // Repair references.
  SetBackwardReferences();
  return *this;
}